

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cpcc cpcc)

{
  StrWriter *this_local;
  Cpcc cpcc_local;
  
  switch(cpcc.raw) {
  case 0:
    operator<<(this,"f");
    break;
  case 1:
    operator<<(this,"eq");
    break;
  case 2:
    operator<<(this,"ogt");
    break;
  case 3:
    operator<<(this,"oge");
    break;
  case 4:
    operator<<(this,"olt");
    break;
  case 5:
    operator<<(this,"ole");
    break;
  case 6:
    operator<<(this,"ogl");
    break;
  case 7:
    operator<<(this,"or");
    break;
  case 8:
    operator<<(this,"un");
    break;
  case 9:
    operator<<(this,"ueq");
    break;
  case 10:
    operator<<(this,"ugt");
    break;
  case 0xb:
    operator<<(this,"uge");
    break;
  case 0xc:
    operator<<(this,"ult");
    break;
  case 0xd:
    operator<<(this,"ule");
    break;
  case 0xe:
    operator<<(this,"ne");
    break;
  case 0xf:
    operator<<(this,"t");
    break;
  case 0x10:
    operator<<(this,"sf");
    break;
  case 0x11:
    operator<<(this,"seq");
    break;
  case 0x12:
    operator<<(this,"gt");
    break;
  case 0x13:
    operator<<(this,"ge");
    break;
  case 0x14:
    operator<<(this,"lt");
    break;
  case 0x15:
    operator<<(this,"le");
    break;
  case 0x16:
    operator<<(this,"gl");
    break;
  case 0x17:
    operator<<(this,"gle");
    break;
  case 0x18:
    operator<<(this,"ngle");
    break;
  case 0x19:
    operator<<(this,"ngl");
    break;
  case 0x1a:
    operator<<(this,"nle");
    break;
  case 0x1b:
    operator<<(this,"nlt");
    break;
  case 0x1c:
    operator<<(this,"nge");
    break;
  case 0x1d:
    operator<<(this,"ngt");
    break;
  case 0x1e:
    operator<<(this,"sne");
    break;
  case 0x1f:
    operator<<(this,"st");
    break;
  default:
    operator<<(this,"?");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cpcc cpcc)
{
    switch (cpcc.raw) {

        case 0:  *this << "f";      break;
        case 1:  *this << "eq";     break;
        case 2:  *this << "ogt";    break;
        case 3:  *this << "oge";    break;
        case 4:  *this << "olt";    break;
        case 5:  *this << "ole";    break;
        case 6:  *this << "ogl";    break;
        case 7:  *this << "or";     break;
        case 8:  *this << "un";     break;
        case 9:  *this << "ueq";    break;
        case 10: *this << "ugt";    break;
        case 11: *this << "uge";    break;
        case 12: *this << "ult";    break;
        case 13: *this << "ule";    break;
        case 14: *this << "ne";     break;
        case 15: *this << "t";      break;
        case 16: *this << "sf";     break;
        case 17: *this << "seq";    break;
        case 18: *this << "gt";     break;
        case 19: *this << "ge";     break;
        case 20: *this << "lt";     break;
        case 21: *this << "le";     break;
        case 22: *this << "gl";     break;
        case 23: *this << "gle";    break;
        case 24: *this << "ngle";   break;
        case 25: *this << "ngl";    break;
        case 26: *this << "nle";    break;
        case 27: *this << "nlt";    break;
        case 28: *this << "nge";    break;
        case 29: *this << "ngt";    break;
        case 30: *this << "sne";    break;
        case 31: *this << "st";     break;

        default:
            *this << "?";
    }
    return *this;
}